

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_ARB1_BREAK(Context *ctx)

{
  char failbranch [32];
  char acStack_38 [40];
  
  if (ctx->profile_supports_nv4 != 0) {
LAB_001151f1:
    output_line(ctx,"BRK;");
    return;
  }
  if (ctx->profile_supports_nv2 != 0) {
    if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) goto LAB_001151f1;
    if (ctx->profile_supports_nv2 != 0) {
      if (1 < (long)ctx->branch_labels_stack_index) {
        snprintf(acStack_38,0x20,"branch_label%d",
                 (ulong)(uint)ctx->branch_labels_stack[ctx->branch_labels_stack_index]);
        output_line(ctx,"BRA %s;",acStack_38);
        return;
      }
      __assert_fail("ctx->branch_labels_stack_index >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x1f04,"void emit_ARB1_BREAK(Context *)");
    }
  }
  failf(ctx,"branching unsupported in %s profile",ctx->profile->name);
  return;
}

Assistant:

static void emit_ARB1_BREAK(Context *ctx)
{
    // nv2 fragment programs (and everything nv4) have a real BREAK.
    if ( (support_nv4(ctx)) || ((support_nv2(ctx)) && (shader_is_pixel(ctx))) )
        output_line(ctx, "BRK;");

    else if (support_nv2(ctx))
    {
        // no BREAK, but we can use branches.
        assert(ctx->branch_labels_stack_index >= 2);
        const int faillabel = ctx->branch_labels_stack[ctx->branch_labels_stack_index];
        char failbranch[32];
        get_ARB1_branch_label_name(ctx,faillabel,failbranch,sizeof(failbranch));
        output_line(ctx, "BRA %s;", failbranch);
    } // else if

    else  // stock ARB1 has no branching.
    {
        failf(ctx, "branching unsupported in %s profile", ctx->profile->name);
    } // else
}